

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp
# Opt level: O3

IterateResult __thiscall
glcts::MultisampleTextureTexStorage2DValidCallsTest::iterate
          (MultisampleTextureTexStorage2DValidCallsTest *this)

{
  GLuint *pGVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 extraout_var;
  int *piVar5;
  long lVar6;
  undefined8 uVar7;
  int n_samples;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  GLint internalformat_max_samples;
  GLint gl_max_depth_texture_samples_value;
  GLint gl_max_color_texture_samples_value;
  int local_78 [2];
  undefined4 *local_70;
  long local_68;
  uint local_5c;
  int local_58;
  uint local_54;
  undefined4 local_50;
  int local_4c;
  MultisampleTextureTexStorage2DValidCallsTest *local_48;
  ulong local_40;
  long local_38;
  long lVar4;
  
  iVar2 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar2);
  initInternals(this);
  uVar10 = 0;
  local_4c = 0;
  (**(code **)(lVar4 + 0x868))(0x910e);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x4b1);
  local_78[1] = 0;
  (**(code **)(lVar4 + 0x868))(0x910f);
  dVar3 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar3,"Could not retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                  ,0x4b7);
  pGVar1 = &this->to_id;
  local_48 = this;
  do {
    if ((int)uVar10 == 0) {
      local_68 = 5;
      piVar5 = &local_4c;
      local_70 = &DAT_01aedde0;
    }
    else if ((int)uVar10 == 2) {
      local_68 = 2;
      piVar5 = local_78 + 1;
      local_70 = &depth_stencil_renderable_internalformats;
    }
    else {
      local_68 = 3;
      piVar5 = local_78 + 1;
      local_70 = &DAT_01aeddf4;
    }
    local_58 = *piVar5;
    uVar7 = CONCAT71((int7)((ulong)local_70 >> 8),1);
    lVar6 = 0;
    local_40 = uVar10;
    do {
      local_5c = (uint)uVar7;
      local_54 = (uint)(byte)(&DAT_01aede00)[lVar6];
      lVar6 = 0;
      do {
        local_50 = local_70[lVar6];
        local_78[0] = 0;
        iVar8 = 1;
        local_38 = lVar6;
        (**(code **)(lVar4 + 0x880))(0x9100,local_50,0x80a9,1,local_78);
        dVar3 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar3,"glGetInternalformativ() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                        ,0x4ff);
        uVar9 = local_54;
        iVar2 = local_78[0];
        if (local_58 <= local_78[0]) {
          iVar2 = local_58;
        }
        if (iVar2 < 2) {
          iVar2 = 1;
        }
        do {
          (**(code **)(lVar4 + 0x1390))(0x9100,iVar8,local_50,1,1,uVar9);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"A valid glTexStorage2DMultisample() call failed",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                          ,0x50c);
          (**(code **)(lVar4 + 0x480))(1,pGVar1);
          (**(code **)(lVar4 + 0x6f8))(1,pGVar1);
          (**(code **)(lVar4 + 0xb8))(0x9100,*pGVar1);
          dVar3 = (**(code **)(lVar4 + 0x800))();
          glu::checkError(dVar3,"Failed to re-create a texture object",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cTextureStorageMultisampleTexStorage2DMultisampleTests.cpp"
                          ,0x514);
          iVar8 = iVar8 + 1;
        } while (iVar8 <= iVar2);
        lVar6 = local_38 + 1;
      } while (lVar6 != local_68);
      lVar6 = 1;
      uVar7 = 0;
    } while ((local_5c & 1) != 0);
    uVar9 = (int)local_40 + 1;
    uVar10 = (ulong)uVar9;
  } while (uVar9 != 3);
  tcu::TestContext::setTestResult
            ((local_48->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult MultisampleTextureTexStorage2DValidCallsTest::iterate()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	initInternals();

	/* Retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value */
	glw::GLint gl_max_color_texture_samples_value = 0;

	gl.getIntegerv(GL_MAX_COLOR_TEXTURE_SAMPLES, &gl_max_color_texture_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_COLOR_TEXTURE_SAMPLES pname value");

	/* Retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value */
	glw::GLint gl_max_depth_texture_samples_value = 0;

	gl.getIntegerv(GL_MAX_DEPTH_TEXTURE_SAMPLES, &gl_max_depth_texture_samples_value);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not retrieve GL_MAX_DEPTH_TEXTURE_SAMPLES pname value");

	/* Iterate through color-, depth- and stencil-renderable internalformats */
	const glw::GLenum  color_internalformats[]   = { GL_R8, GL_RGB565, GL_RGB10_A2UI, GL_SRGB8_ALPHA8, GL_R8I };
	const glw::GLenum  depth_internalformats[]   = { GL_DEPTH_COMPONENT16, GL_DEPTH_COMPONENT32F, GL_DEPTH24_STENCIL8 };
	const glw::GLenum  stencil_internalformats[] = { GL_DEPTH24_STENCIL8, GL_DEPTH32F_STENCIL8 };
	const unsigned int n_color_internalformats   = sizeof(color_internalformats) / sizeof(color_internalformats[0]);
	const unsigned int n_depth_internalformats   = sizeof(depth_internalformats) / sizeof(depth_internalformats[0]);
	const unsigned int n_stencil_internalformats = sizeof(stencil_internalformats) / sizeof(stencil_internalformats[0]);

	for (unsigned int n_iteration = 0; n_iteration < 3 /* color/depth/stencil */; ++n_iteration)
	{
		const glw::GLenum* internalformats						   = NULL;
		glw::GLint		   max_iteration_specific_gl_samples_value = 0;
		unsigned int	   n_internalformats					   = 0;

		switch (n_iteration)
		{
		case 0:
		{
			internalformats							= color_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_color_texture_samples_value;
			n_internalformats						= n_color_internalformats;

			break;
		}

		case 1:
		{
			internalformats							= depth_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_depth_texture_samples_value;
			n_internalformats						= n_depth_internalformats;

			break;
		}

		case 2:
		{
			internalformats							= stencil_internalformats;
			max_iteration_specific_gl_samples_value = gl_max_depth_texture_samples_value;
			n_internalformats						= n_stencil_internalformats;

			break;
		}

		default:
		{
			TCU_FAIL("Unrecognized iteration index");
		}
		} /* switch (n_iteration) */

		/* Iterate through valid fixedsamplelocations argument values */
		const glw::GLboolean fixedsamplelocations_values[] = { GL_FALSE, GL_TRUE };
		const unsigned int   n_fixedsamplelocations_values =
			sizeof(fixedsamplelocations_values) / sizeof(fixedsamplelocations_values[0]);

		for (unsigned int n_fixedsamplelocations_value = 0;
			 n_fixedsamplelocations_value < n_fixedsamplelocations_values; ++n_fixedsamplelocations_value)
		{
			glw::GLboolean fixedsamplelocations = fixedsamplelocations_values[n_fixedsamplelocations_value];

			/* Iterate through internalformats */
			for (unsigned int n_internalformat = 0; n_internalformat < n_internalformats; ++n_internalformat)
			{
				glw::GLenum internalformat			   = internalformats[n_internalformat];
				glw::GLint  internalformat_max_samples = 0;

				/* Retrieve internalformat-specific GL_MAX_SAMPLES value */
				gl.getInternalformativ(GL_TEXTURE_2D_MULTISAMPLE,	 /* target */
									   internalformat, GL_SAMPLES, 1, /* bufSize */
									   &internalformat_max_samples);

				GLU_EXPECT_NO_ERROR(gl.getError(), "glGetInternalformativ() failed");

				/* Determine maximum amount of samples we can use for the test*/
				glw::GLint max_samples =
					de::max(1, de::min(internalformat_max_samples, max_iteration_specific_gl_samples_value));

				/* Iterate through all valid samples argument values */
				for (int n_samples = 1; n_samples <= max_samples; ++n_samples)
				{
					gl.texStorage2DMultisample(GL_TEXTURE_2D_MULTISAMPLE, n_samples, internalformat, 1, /* width */
											   1,														/* height */
											   fixedsamplelocations); /* fixedsamplelocations */

					GLU_EXPECT_NO_ERROR(gl.getError(), "A valid glTexStorage2DMultisample() call failed");

					/* Re-create the texture object before we continue */
					gl.deleteTextures(1, &to_id);
					gl.genTextures(1, &to_id);

					gl.bindTexture(GL_TEXTURE_2D_MULTISAMPLE, to_id);

					GLU_EXPECT_NO_ERROR(gl.getError(), "Failed to re-create a texture object");
				} /* for (all samples argument values) */
			}	 /* for (all color-renderable internalformats) */
		}		  /* for (all fixedsamplelocations argument values) */
	}			  /* for (all iterations) */

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}